

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O1

float64 helper_rintd_arm(float64 x,void *fp_status)

{
  byte bVar1;
  float64 fVar2;
  
  bVar1 = *(byte *)((long)fp_status + 2);
  fVar2 = float64_round_to_int_arm(x,(float_status *)fp_status);
  if ((bVar1 & 0x20) == 0) {
    *(byte *)((long)fp_status + 2) = *(byte *)((long)fp_status + 2) & 0xdf;
  }
  return fVar2;
}

Assistant:

float64 HELPER(rintd)(float64 x, void *fp_status)
{
    int old_flags = get_float_exception_flags(fp_status), new_flags;
    float64 ret;

    ret = float64_round_to_int(x, fp_status);

    new_flags = get_float_exception_flags(fp_status);

    /* Suppress any inexact exceptions the conversion produced */
    if (!(old_flags & float_flag_inexact)) {
        new_flags = get_float_exception_flags(fp_status);
        set_float_exception_flags(new_flags & ~float_flag_inexact, fp_status);
    }

    return ret;
}